

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::EagerPromiseNodeBase::EagerPromiseNodeBase
          (EagerPromiseNodeBase *this,OwnPromiseNode *dependencyParam,ExceptionOrValue *resultRef,
          SourceLocation location)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other;
  PromiseNode *pPVar1;
  ExceptionOrValue *resultRef_local;
  OwnPromiseNode *dependencyParam_local;
  EagerPromiseNodeBase *this_local;
  
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0059f1a8;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_0059f1f0;
  other = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(dependencyParam);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&this->dependency,other);
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  this->resultRef = resultRef;
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->dependency);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])();
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->dependency);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

EagerPromiseNodeBase::EagerPromiseNodeBase(
    OwnPromiseNode&& dependencyParam, ExceptionOrValue& resultRef, SourceLocation location)
    : Event(location), dependency(kj::mv(dependencyParam)), resultRef(resultRef) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}